

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5_handler_from_function.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  JNIEnv local_10;
  undefined4 local_c;
  JNIEnv jvm;
  
  local_c = 0;
  JNIEnv::JNIEnv(&local_10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  bVar1 = f(&local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = g(&local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
   JNIEnv jvm;
   std::cout << std::boolalpha << f(&jvm) << std::endl << g(&jvm) << std::endl;
	return EXIT_SUCCESS;
}